

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_2,_3>_>::doPrint
          (VariableStatement<tcu::Matrix<float,_2,_3>_> *this,ostream *os)

{
  Expr<tcu::Matrix<float,_2,_3>_> *pEVar1;
  ostream *poVar2;
  Precision in_EDX;
  VarType local_90;
  string local_78;
  DeclareVariable local_58;
  
  if (this->m_isDeclaration == true) {
    glu::varTypeOf<tcu::Matrix<float,2,3>>(&local_90,(glu *)0x3,in_EDX);
    std::__cxx11::string::string
              ((string *)&local_78,
               (string *)
               &((this->m_variable).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                .m_ptr)->m_name);
    glu::decl::DeclareVariable::DeclareVariable(&local_58,&local_90,&local_78,0);
    glu::decl::operator<<(os,&local_58);
    glu::decl::DeclareVariable::~DeclareVariable(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    glu::VarType::~VarType(&local_90);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_58,
               (string *)
               &((this->m_variable).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                .m_ptr)->m_name);
    std::operator<<(os,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  poVar2 = std::operator<<(os," = ");
  pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_3>_>.
           super_ExprPBase<tcu::Matrix<float,_2,_3>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_3>_>_>
           .m_ptr;
  (*(pEVar1->super_ExprBase)._vptr_ExprBase[2])(pEVar1,poVar2);
  std::operator<<(poVar2,";\n");
  return;
}

Assistant:

void			doPrint				(ostream& os)							const
	{
		if (m_isDeclaration)
			os << glu::declare(getVarTypeOf<T>(), m_variable->getName());
		else
			os << m_variable->getName();

		os << " = " << *m_value << ";\n";
	}